

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragDepthTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Functional::FragDepthTests::init(FragDepthTests *this,EVP_PKEY_CTX *ctx)

{
  TestNode *pTVar1;
  FragDepthWriteCase *this_00;
  undefined8 extraout_RAX;
  undefined8 uVar2;
  FragDepthCompareCase *this_01;
  undefined8 extraout_RAX_00;
  long lVar3;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"write",
             "gl_FragDepth write tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  for (lVar3 = 0x18; lVar3 != 0x138; lVar3 = lVar3 + 0x20) {
    this_00 = (FragDepthWriteCase *)operator_new(0xa0);
    FragDepthWriteCase::FragDepthWriteCase
              (this_00,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_00c267d8 + lVar3),
               *(char **)((long)&PTR_iterate_00c267e0 + lVar3),
               *(char **)((long)&init::cases[0].name + lVar3),
               *(EvalFragDepthFunc *)(&UNK_00c267e8 + lVar3));
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_00);
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"compare",
             "gl_FragDepth used with depth comparison");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  uVar2 = extraout_RAX;
  for (lVar3 = 0x18; lVar3 != 0x138; lVar3 = lVar3 + 0x20) {
    this_01 = (FragDepthCompareCase *)operator_new(0xa8);
    FragDepthCompareCase::FragDepthCompareCase
              (this_01,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&PTR_deinit_00c267d8 + lVar3),
               *(char **)((long)&PTR_iterate_00c267e0 + lVar3),
               *(char **)((long)&init::cases[0].name + lVar3),
               *(EvalFragDepthFunc *)(&UNK_00c267e8 + lVar3),0x201);
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_01);
    uVar2 = extraout_RAX_00;
  }
  return (int)uVar2;
}

Assistant:

void FragDepthTests::init (void)
{
	static const struct
	{
		const char*			name;
		const char*			desc;
		EvalFragDepthFunc	evalFunc;
		const char*			fragSrc;
	} cases[] =
	{
		{
			"no_write", "No gl_FragDepth write", evalNoWrite,
			"#version 300 es\n"
			"uniform highp vec4 u_color;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = u_color;\n"
			"}\n"
		},
		{
			"const", "Const depth write", evalConstDepth,
			"#version 300 es\n"
			"uniform highp vec4 u_color;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = u_color;\n"
			"	gl_FragDepth = 0.5;\n"
			"}\n"
		},
		{
			"uniform", "Uniform depth write", evalConstDepth,
			"#version 300 es\n"
			"uniform highp vec4 u_color;\n"
			"uniform highp float uf_half;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = u_color;\n"
			"	gl_FragDepth = uf_half;\n"
			"}\n"
		},
		{
			"dynamic", "Dynamic depth write", evalDynamicDepth,
			"#version 300 es\n"
			"uniform highp vec4 u_color;\n"
			"in highp vec2 v_coord;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = u_color;\n"
			"	gl_FragDepth = (v_coord.x+v_coord.y)*0.5;\n"
			"}\n"
		},
		{
			"fragcoord_z", "gl_FragDepth write from gl_FragCoord.z", evalNoWrite,
			"#version 300 es\n"
			"uniform highp vec4 u_color;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = u_color;\n"
			"	gl_FragDepth = gl_FragCoord.z;\n"
			"}\n"
		},
		{
			"uniform_conditional_write", "Uniform conditional write", evalDynamicDepth,
			"#version 300 es\n"
			"uniform highp vec4 u_color;\n"
			"uniform bool ub_true;\n"
			"in highp vec2 v_coord;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = u_color;\n"
			"	if (ub_true)\n"
			"		gl_FragDepth = (v_coord.x+v_coord.y)*0.5;\n"
			"}\n"
		},
		{
			"dynamic_conditional_write", "Uniform conditional write", evalDynamicConditionalDepth,
			"#version 300 es\n"
			"uniform highp vec4 u_color;\n"
			"uniform bool ub_true;\n"
			"in highp vec2 v_coord;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = u_color;\n"
			"	mediump float d = (v_coord.x+v_coord.y)*0.5f;\n"
			"	if (v_coord.y < 0.5)\n"
			"		gl_FragDepth = d;\n"
			"	else\n"
			"		gl_FragDepth = 1.0 - d;\n"
			"}\n"
		},
		{
			"uniform_loop_write", "Uniform loop write", evalConstDepth,
			"#version 300 es\n"
			"uniform highp vec4 u_color;\n"
			"uniform int ui_two;\n"
			"uniform highp float uf_fourth;\n"
			"in highp vec2 v_coord;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = u_color;\n"
			"	gl_FragDepth = 0.0;\n"
			"	for (int i = 0; i < ui_two; i++)\n"
			"		gl_FragDepth += uf_fourth;\n"
			"}\n"
		},
		{
			"write_in_function", "Uniform loop write", evalDynamicDepth,
			"#version 300 es\n"
			"uniform highp vec4 u_color;\n"
			"uniform highp float uf_half;\n"
			"in highp vec2 v_coord;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void myfunc (highp vec2 coord)\n"
			"{\n"
			"	gl_FragDepth = (coord.x+coord.y)*0.5;\n"
			"}\n"
			"void main (void)\n"
			"{\n"
			"	o_color = u_color;\n"
			"	myfunc(v_coord);\n"
			"}\n"
		}
	};

	// .write
	tcu::TestCaseGroup* writeGroup = new tcu::TestCaseGroup(m_testCtx, "write", "gl_FragDepth write tests");
	addChild(writeGroup);
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		writeGroup->addChild(new FragDepthWriteCase(m_context, cases[ndx].name, cases[ndx].desc, cases[ndx].fragSrc, cases[ndx].evalFunc));

	// .compare
	tcu::TestCaseGroup* compareGroup = new tcu::TestCaseGroup(m_testCtx, "compare", "gl_FragDepth used with depth comparison");
	addChild(compareGroup);
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		compareGroup->addChild(new FragDepthCompareCase(m_context, cases[ndx].name, cases[ndx].desc, cases[ndx].fragSrc, cases[ndx].evalFunc, GL_LESS));
}